

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O3

void splittingStep_Free(ARKodeMem ark_mem)

{
  undefined8 *__ptr;
  
  __ptr = (undefined8 *)ark_mem->step_mem;
  if (__ptr != (undefined8 *)0x0) {
    if ((void *)*__ptr != (void *)0x0) {
      free((void *)*__ptr);
    }
    if ((void *)__ptr[2] != (void *)0x0) {
      free((void *)__ptr[2]);
    }
    SplittingStepCoefficients_Destroy((SplittingStepCoefficients *)(__ptr + 1));
    free(__ptr);
  }
  ark_mem->step_mem = (void *)0x0;
  return;
}

Assistant:

static void splittingStep_Free(ARKodeMem ark_mem)
{
  ARKodeSplittingStepMem step_mem = (ARKodeSplittingStepMem)ark_mem->step_mem;
  if (step_mem != NULL)
  {
    if (step_mem->steppers != NULL) { free(step_mem->steppers); }
    if (step_mem->n_stepper_evolves != NULL)
    {
      free(step_mem->n_stepper_evolves);
    }
    SplittingStepCoefficients_Destroy(&step_mem->coefficients);
    free(step_mem);
  }
  ark_mem->step_mem = NULL;
}